

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEnterProximityEvent,unsigned_long,QPointingDevice_const*>
               (unsigned_long args,QPointingDevice *args_1)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  QFlags<QEventLoop::ProcessEventsFlag> *in_RSI;
  QPointingDevice *in_RDI;
  long in_FS_OFFSET;
  TabletEnterProximityEvent event;
  ProcessEventsFlag in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  WindowSystemEvent *in_stack_ffffffffffffffb8;
  TabletEnterProximityEvent *in_stack_ffffffffffffffc0;
  byte local_38;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QThread::isMainThread();
  if ((uVar3 & 1) == 0) {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::TabletEnterProximityEvent,unsigned_long,QPointingDevice_const*>
              (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags(in_RSI,in_stack_ffffffffffffff9c);
    bVar1 = QWindowSystemInterface::flushWindowSystemEvents
                      ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
                       SUB84((ulong)lVar4 >> 0x20,0));
    goto LAB_0044fbcf;
  }
  memset(&stack0xffffffffffffffb8,0xaa,0x40);
  QWindowSystemInterfacePrivate::TabletEnterProximityEvent::TabletEnterProximityEvent
            (in_stack_ffffffffffffffc0,(ulong)in_stack_ffffffffffffffb8,
             (QPointingDevice *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(in_stack_ffffffffffffffb8);
LAB_0044fb87:
    bVar1 = local_38 & 1;
  }
  else {
    uVar2 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&stack0xffffffffffffffb8);
    if ((uVar2 & 1) != 0) goto LAB_0044fb87;
    bVar1 = 0;
  }
  QWindowSystemInterfacePrivate::TabletEnterProximityEvent::~TabletEnterProximityEvent
            ((TabletEnterProximityEvent *)0x44fba3);
LAB_0044fbcf:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}